

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall DReachabilityPropagator::remove_deg1(DReachabilityPropagator *this,int u)

{
  anon_union_8_2_743a5d44_for_Reason_0 aVar1;
  byte bVar2;
  pointer pvVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  char *pcVar7;
  anon_union_8_2_743a5d44_for_Reason_0 aVar8;
  pointer piVar9;
  BoolView *pBVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  undefined8 unaff_RBP;
  anon_union_8_2_743a5d44_for_Reason_0 *elem;
  ulong uVar14;
  Lit *elem_00;
  size_t sVar15;
  int iVar16;
  int *pt;
  ulong uVar17;
  uint *puVar18;
  int *pt_1;
  Clause *c;
  int last_seen;
  int oe;
  Clause *expl;
  uint local_8c;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  undefined8 uStack_80;
  Clause *local_78;
  uint local_70;
  uint local_6c;
  vec<Lit> local_68;
  vec<Lit> local_58;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_40;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  uVar12 = (uint)unaff_RBP;
  pBVar10 = (this->super_GraphPropagator).vs.data;
  if (sat.assigns.data[(uint)pBVar10[(uint)u].v] != '\0') {
    puVar13 = (uint *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    uVar12 = (uint)puVar13;
    if ((uint)pBVar10[(uint)u].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar10[(uint)u].v])
    goto LAB_001cc831;
  }
  uVar11 = this->root;
  local_8c = u;
  if (uVar11 == u) {
    if (1 < this->in_nodes_size) {
      local_78 = (Clause *)CONCAT44(local_78._4_4_,0xffffffff);
      local_68.sz = 0;
      local_68.cap = 0;
      local_68.data = (Lit *)0x0;
      if (so.lazy) {
        vec<Lit>::push(&local_68);
        u = this->root;
      }
      pvVar3 = (this->ou).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar18 = *(uint **)&pvVar3[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
      puVar13 = (uint *)pvVar3[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      if (puVar18 == puVar13) {
LAB_001cc00f:
        bVar5 = true;
      }
      else {
        iVar16 = 0;
        pcVar7 = sat.assigns.data;
        do {
          uVar12 = *puVar18;
          pBVar10 = (this->super_GraphPropagator).es.data;
          uVar11 = pBVar10[uVar12].v;
          bVar2 = pcVar7[uVar11];
          if ((bVar2 == 0) || ((uint)pBVar10[uVar12].s * -2 + 1 == (int)(char)bVar2)) {
            iVar16 = iVar16 + 1;
            local_78 = (Clause *)CONCAT44(local_78._4_4_,uVar12);
          }
          else if (so.lazy == true) {
            local_88._a._0_4_ = (uint)(bVar2 < 0xfe) + uVar11 * 2;
            vec<Lit>::push(&local_68,(Lit *)&local_88);
            pcVar7 = sat.assigns.data;
          }
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar13);
        if (iVar16 == 1) {
          bVar5 = true;
          if (this->in_nodes_size < 2) goto LAB_001cc00f;
          uVar17 = (ulong)local_78 & 0xffffffff;
          pBVar10 = (this->super_GraphPropagator).es.data;
          if (sat.assigns.data[(uint)pBVar10[uVar17].v] == '\0') {
            if (so.lazy == true) {
              puVar13 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
              puVar18 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
              if (puVar13 == puVar18) {
                uVar17 = 0xffffffff;
              }
              else {
                do {
                  uVar12 = *puVar13;
                  if (uVar12 != local_8c) goto LAB_001cc007;
                  puVar13 = puVar13 + 1;
                } while (puVar13 != puVar18);
                uVar12 = 0xffffffff;
LAB_001cc007:
                uVar17 = (ulong)uVar12;
              }
              uVar12 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
              local_88._a._0_4_ =
                   (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2;
              vec<Lit>::push(&local_68,(Lit *)&local_88);
              uVar12 = (this->super_GraphPropagator).vs.data[uVar17].v;
              local_88._a._0_4_ =
                   (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2;
              vec<Lit>::push(&local_68,(Lit *)&local_88);
              uVar12 = local_68.sz;
              uVar17 = local_68._0_8_ & 0xffffffff;
              sVar15 = 8;
              if (local_68.sz != 0) {
                sVar15 = (ulong)(local_68.sz - 1) * 4 + 8;
              }
              local_88._pt = (Clause *)malloc(sVar15);
              uVar11 = uVar12 << 8;
              (local_88._pt)->data[0].x = -2;
              *(uint *)local_88._pt = uVar11;
              if (uVar12 != 0) {
                uVar14 = 0;
                do {
                  (local_88._pt)->data[uVar14].x = local_68.data[uVar14].x;
                  uVar14 = uVar14 + 1;
                } while (uVar17 != uVar14);
              }
              *(uint *)local_88._pt = uVar11 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
              uVar17 = (ulong)local_78 & 0xffffffff;
              pBVar10 = (this->super_GraphPropagator).es.data;
              aVar8 = local_88;
            }
            else {
              aVar8._pt = (Clause *)0x0;
            }
            SAT::cEnqueue(&sat,(Lit)((uint)pBVar10[uVar17].s + pBVar10[uVar17].v * 2),(Reason)aVar8)
            ;
            iVar16 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                               (this,(ulong)local_78 & 0xffffffff);
            if ((char)iVar16 == '\0') {
LAB_001cc5b0:
              bVar5 = false;
              puVar13 = (uint *)0x0;
            }
            else {
              aVar1._pt = (Clause *)(this->last_state_e + local_78._0_4_);
              uStack_80 = (void *)CONCAT44(4,*(undefined4 *)aVar1._pt);
              local_88._pt = aVar1._pt;
              vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
              *(undefined4 *)aVar1._pt = 0;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&this->new_edge,(int *)&local_78);
              pBVar10 = (this->super_GraphPropagator).vs.data;
              uVar17 = (ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_78._0_4_].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4);
              uVar12 = pBVar10[uVar17].v;
              if (sat.assigns.data[uVar12] == '\0') {
                if (so.lazy == true) {
                  local_88._pt = (Clause *)0x0;
                  uStack_80 = (void *)0x0;
                  vec<Lit>::push((vec<Lit> *)&local_88);
                  uVar12 = (this->super_GraphPropagator).es.data[(ulong)local_78 & 0xffffffff].v;
                  local_58.sz = (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2
                  ;
                  vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_58);
                  aVar8._pt = Reason_new<vec<Lit>>((vec<Lit> *)&local_88);
                  if (uStack_80 != (void *)0x0) {
                    free(uStack_80);
                  }
                  pBVar10 = (this->super_GraphPropagator).vs.data;
                  uVar17 = (ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                                                                            
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_78._0_4_].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4);
                  uVar12 = pBVar10[uVar17].v;
                }
                SAT::cEnqueue(&sat,(Lit)((uint)pBVar10[uVar17].s + uVar12 * 2),(Reason)aVar8);
                aVar8._pt = (Clause *)
                            (this->last_state_n +
                            *(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [local_78._0_4_].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + 4));
                uStack_80 = (void *)CONCAT44(4,*(int *)aVar8._pt);
                local_88._pt = aVar8._pt;
                vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
                *(int *)aVar8._pt = 0;
                add_innode(this,*(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_78._0_4_].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
                local_88._a._0_4_ =
                     *(undefined4 *)
                      (*(long *)&(this->super_GraphPropagator).endnodes.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_78._0_4_].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 4);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>(&(this->new_node)._M_t,(int *)&local_88._a);
              }
              else if ((uint)pBVar10[uVar17].s * 2 + -1 == (int)sat.assigns.data[uVar12]) {
                if (so.lazy == true) {
                  local_88._pt = (Clause *)0x0;
                  uStack_80 = (void *)0x0;
                  uVar12 = (this->super_GraphPropagator).es.data[(ulong)local_78 & 0xffffffff].v;
                  elem_00 = (Lit *)&local_58;
                  local_58.sz = (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2
                  ;
                  vec<Lit>::push((vec<Lit> *)&local_88,elem_00);
                  local_58._0_8_ = Clause_new<vec<Lit>>((vec<Lit> *)&local_88,SUB81(elem_00,0));
                  *(byte *)local_58._0_8_ = *(byte *)local_58._0_8_ | 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_58);
                  sat.confl = (Clause *)local_58._0_8_;
                  if (uStack_80 != (void *)0x0) {
                    free(uStack_80);
                  }
                }
                goto LAB_001cc5b0;
              }
              puVar13 = (uint *)CONCAT71((int7)((ulong)&local_78 >> 8),1);
              bVar5 = false;
            }
          }
        }
        else {
          bVar5 = true;
        }
      }
      uVar12 = (uint)puVar13;
      if (local_68.data != (Lit *)0x0) {
        free(local_68.data);
      }
      if (!bVar5) goto LAB_001cc831;
      uVar11 = this->root;
      goto LAB_001cbd7e;
    }
  }
  else {
LAB_001cbd7e:
    if (local_8c != uVar11) {
      local_68.sz = 0;
      local_68.cap = 0;
      local_68.data = (Lit *)0x0;
      local_58._0_8_ = (Clause *)0x0;
      local_58.data = (Lit *)0x0;
      if (so.lazy == true) {
        vec<Lit>::push(&local_68);
      }
      pvVar3 = (this->in).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar13 = *(uint **)&pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data;
      puVar18 = (uint *)pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      local_70 = uVar12;
      if (puVar13 == puVar18) {
LAB_001cbe96:
        uVar17 = (ulong)local_8c;
        pBVar10 = (this->super_GraphPropagator).vs.data;
        uVar12 = pBVar10[uVar17].v;
        bVar2 = sat.assigns.data[uVar12];
        puVar13 = (uint *)(ulong)local_70;
        if (bVar2 == 0) {
          if (so.lazy == true) {
            local_88._a._0_4_ =
                 (uint)((int)sat.assigns.data[(uint)pBVar10[(uint)this->root].v] - 1U < 0xfffffffd)
                 + pBVar10[(uint)this->root].v * 2;
            vec<Lit>::push(&local_68,(Lit *)&local_88);
            uVar12 = local_68.sz;
            uVar17 = local_68._0_8_ & 0xffffffff;
            sVar15 = 8;
            if (local_68.sz != 0) {
              sVar15 = (ulong)(local_68.sz - 1) * 4 + 8;
            }
            local_88._pt = (Clause *)malloc(sVar15);
            uVar11 = uVar12 << 8;
            (local_88._pt)->data[0].x = -2;
            *(uint *)local_88._pt = uVar11;
            if (uVar12 != 0) {
              uVar14 = 0;
              do {
                (local_88._pt)->data[uVar14].x = local_68.data[uVar14].x;
                uVar14 = uVar14 + 1;
              } while (uVar17 != uVar14);
            }
            *(uint *)local_88._pt = uVar11 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
            uVar17 = (ulong)local_8c;
            pBVar10 = (this->super_GraphPropagator).vs.data;
            uVar12 = pBVar10[uVar17].v;
            aVar8 = local_88;
          }
          else {
            aVar8._pt = (Clause *)0x0;
          }
          SAT::cEnqueue(&sat,(Lit)((pBVar10[uVar17].s ^ 1) + uVar12 * 2),(Reason)aVar8);
          iVar16 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                             (this,(ulong)local_8c);
          if ((char)iVar16 == '\0') goto LAB_001cc806;
          aVar1._pt = (Clause *)(this->last_state_n + (int)local_8c);
          uStack_80 = (void *)CONCAT44(4,*(undefined4 *)aVar1._pt);
          local_88._pt = aVar1._pt;
          vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
          *(undefined4 *)aVar1._pt = 1;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->rem_node,(int *)&local_8c);
          if (so.lazy == true) {
            local_88._pt = (Clause *)0x0;
            uStack_80 = (void *)0x0;
            vec<Lit>::push((vec<Lit> *)&local_88);
            uVar12 = (this->super_GraphPropagator).vs.data[local_8c].v;
            local_78 = (Clause *)
                       CONCAT44(local_78._4_4_,
                                (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2
                               );
            vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_78);
            aVar8._pt = Reason_new<vec<Lit>>((vec<Lit> *)&local_88);
            if (uStack_80 != (void *)0x0) {
              free(uStack_80);
            }
          }
          pvVar3 = (this->ou).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar9 = pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = true;
          if (pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar9) {
            local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->rem_edge;
            uVar17 = 0;
            uVar14 = 1;
            local_38 = aVar8;
            do {
              local_6c = piVar9[uVar17];
              iVar16 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])
                                 (this,(ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).
                                                                  endnodes.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)local_6c].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
              if ((char)iVar16 == '\0') goto LAB_001cc806;
              uVar17 = (ulong)local_6c;
              pBVar10 = (this->super_GraphPropagator).es.data;
              if (sat.assigns.data[(uint)pBVar10[uVar17].v] == '\0') {
                SAT::cEnqueue(&sat,(Lit)((pBVar10[uVar17].s ^ 1) + pBVar10[uVar17].v * 2),
                              (Reason)local_38);
                aVar8._pt = (Clause *)(this->last_state_e + (int)local_6c);
                uStack_80 = (void *)CONCAT44(4,*(undefined4 *)aVar8._pt);
                local_88._pt = aVar8._pt;
                vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
                *(undefined4 *)aVar8._pt = 1;
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>(local_40,(int *)&local_6c);
              }
              else if ((uint)pBVar10[uVar17].s * -2 + 1 ==
                       (int)sat.assigns.data[(uint)pBVar10[uVar17].v]) {
                if (so.lazy == true) {
                  local_88._pt = (Clause *)0x0;
                  uStack_80 = (void *)0x0;
                  uVar12 = (this->super_GraphPropagator).vs.data[local_8c].v;
                  local_78 = (Clause *)
                             CONCAT44(local_78._4_4_,
                                      (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) +
                                      uVar12 * 2);
                  vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_78);
                  uVar6 = local_88._a._0_4_;
                  uVar17 = local_88._a & 0xffffffff;
                  sVar15 = 8;
                  if (local_88._a._0_4_ != 0) {
                    sVar15 = (ulong)(local_88._a._0_4_ - 1) * 4 + 8;
                  }
                  local_78 = (Clause *)malloc(sVar15);
                  uVar12 = uVar6 << 8;
                  local_78->data[0].x = -2;
                  *(uint *)local_78 = uVar12;
                  if (uVar6 != 0) {
                    uVar14 = 0;
                    do {
                      local_78->data[uVar14].x = *(int *)((long)uStack_80 + uVar14 * 4);
                      uVar14 = uVar14 + 1;
                    } while (uVar17 != uVar14);
                  }
                  *(uint *)local_78 = uVar12 | 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_78);
                  sat.confl = local_78;
                  if (uStack_80 != (void *)0x0) {
                    free(uStack_80);
                  }
                }
                goto LAB_001cc806;
              }
              pvVar3 = (this->ou).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar9 = pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar4 = uVar14 < (ulong)((long)pvVar3[(int)local_8c].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish - (long)piVar9 >> 2);
              uVar17 = uVar14;
              uVar14 = (ulong)((int)uVar14 + 1);
            } while (bVar4);
          }
          puVar13 = (uint *)(ulong)local_70;
        }
        else {
          bVar5 = true;
          if ((uint)pBVar10[uVar17].s * -2 + 1 == (int)(char)bVar2) {
            if (so.lazy == true) {
              local_88._a._0_4_ = (uint)(bVar2 < 0xfe) + uVar12 * 2;
              vec<Lit>::push(&local_58,(Lit *)&local_88);
              uVar12 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
              local_88._a._0_4_ =
                   (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2;
              elem = &local_88;
              vec<Lit>::push(&local_58,(Lit *)elem);
              local_88._pt = Clause_new<vec<Lit>>(&local_58,SUB81(elem,0));
              *(byte *)local_88._pt = *(byte *)local_88._pt | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
              sat.confl = local_88._pt;
            }
LAB_001cc806:
            bVar5 = false;
            puVar13 = (uint *)0x0;
          }
        }
      }
      else {
        iVar16 = 0;
        pcVar7 = sat.assigns.data;
        do {
          uVar12 = *puVar13;
          pBVar10 = (this->super_GraphPropagator).es.data;
          uVar11 = pBVar10[uVar12].v;
          bVar2 = pcVar7[uVar11];
          if ((bVar2 == 0) || ((uint)pBVar10[uVar12].s * -2 + 1 == (int)(char)bVar2)) {
            iVar16 = iVar16 + 1;
          }
          else if (so.lazy == true) {
            local_88._a._0_4_ = (uint)(bVar2 < 0xfe) + uVar11 * 2;
            vec<Lit>::push(&local_68,(Lit *)&local_88);
            uVar12 = (this->super_GraphPropagator).es.data[uVar12].v;
            local_88._a._0_4_ = (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2
            ;
            vec<Lit>::push(&local_58,(Lit *)&local_88);
            pcVar7 = sat.assigns.data;
          }
          puVar13 = puVar13 + 1;
        } while (puVar13 != puVar18);
        if (iVar16 < 1) goto LAB_001cbe96;
        puVar13 = (uint *)0x1;
        bVar5 = false;
      }
      if (local_58.data != (Lit *)0x0) {
        free(local_58.data);
      }
      if (local_68.data != (Lit *)0x0) {
        free(local_68.data);
      }
      if (!bVar5) goto LAB_001cc831;
    }
  }
  puVar13 = (uint *)0x1;
LAB_001cc831:
  return (bool)((byte)puVar13 & 1);
}

Assistant:

bool DReachabilityPropagator::remove_deg1(int u) {
	if (DEBUG) {
		std::cout << "Remove deg1 from " << u << '\n';
	}
	if (getNodeVar(u).isFixed() && getNodeVar(u).isFalse()) {
		return true;
	}

	if (u == get_root_idx() && in_nodes_size > 1) {
		Clause* r = nullptr;
		int out_deg = 0;
		int last_seen = -1;
		vec<Lit> ps_out;
		if (so.lazy) {
			ps_out.push();
		}
		for (const int oe : ou[get_root_idx()]) {
			if (!getEdgeVar(oe).isFixed() || getEdgeVar(oe).isTrue()) {
				out_deg++;
				last_seen = oe;
			} else if (so.lazy) {
				ps_out.push(getEdgeVar(oe).getValLit());
			}
		}
		if (out_deg == 1 && in_nodes_size > 1 && !getEdgeVar(last_seen).isFixed()) {
			if (so.lazy) {
				const int other = get_some_innode_not(u);
				assert(other != -1);
				ps_out.push(getNodeVar(get_root_idx()).getValLit());
				ps_out.push(getNodeVar(other).getValLit());
				r = Reason_new(ps_out);
			}
			getEdgeVar(last_seen).setVal(true, r);
			if (!propagateNewEdge(last_seen)) {
				return false;
			}
			last_state_e[last_seen] = VT_IN;
			new_edge.insert(last_seen);
			if (DEBUG) {
				std::cout << "Edge in " << last_seen << '\n';
			}
			// Propagate New Edge already does this.
			// We enforce the other extremity if not there yet:
			//*
			if (!getNodeVar(getHead(last_seen)).isFixed()) {
				if (so.lazy) {
					vec<Lit> ps;
					ps.push();
					ps.push(getEdgeVar(last_seen).getValLit());
					r = Reason_new(ps);
				}
				getNodeVar(getHead(last_seen)).setVal(true, r);
				last_state_n[getHead(last_seen)] = VT_IN;
				add_innode(getHead(last_seen));
				new_node.insert(getHead(last_seen));
				if (DEBUG) {
					std::cout << "Node in " << getHead(last_seen) << '\n';
				}
			} else if (getNodeVar(getHead(last_seen)).isFalse()) {
				if (so.lazy) {
					vec<Lit> psfail;
					psfail.push(getEdgeVar(last_seen).getValLit());
					Clause* expl = Clause_new(psfail);
					expl->temp_expl = 1;
					sat.rtrail.last().push(expl);
					sat.confl = expl;
				}
				if (DEBUG) {
					std::cout << "False " << __FILE__ << __LINE__ << '\n';
				}
				return false;
			}  //*/

			return true;
		}
	}

	if (u != get_root_idx()) {
		int in_deg = 0;
		vec<Lit> ps_in;
		vec<Lit> ps_in_fail;
		if (so.lazy) {
			ps_in.push();
		}

		for (const int ie : in[u]) {
			if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
				in_deg++;
			} else if (so.lazy) {
				ps_in.push(getEdgeVar(ie).getValLit());
				ps_in_fail.push(getEdgeVar(ie).getValLit());
			}
		}

		if (in_deg > 0) {
			return true;
		}

		if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
			// Fail because no way to get to this node
			if (so.lazy) {
				ps_in_fail.push(getNodeVar(u).getValLit());
				ps_in_fail.push(getNodeVar(get_root_idx()).getValLit());
				Clause* expl = Clause_new(ps_in_fail);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			if (DEBUG) {
				std::cout << "False " << u << " " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		Clause* r = nullptr;
		if (!getNodeVar(u).isFixed()) {
			// Force the node to be out.
			if (so.lazy) {
				ps_in.push(getNodeVar(get_root_idx()).getValLit());
				r = Reason_new(ps_in);
			}
			getNodeVar(u).setVal(false, r);
			if (!propagateRemNode(u)) {
				return false;
			}
			last_state_n[u] = VT_OUT;
			rem_node.insert(u);
			if (DEBUG) {
				std::cout << "Node out " << u << '\n';
			}
			//*
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(u).getValLit());
				r = Reason_new(ps);
			}  //*/
			for (unsigned int i = 0; i < ou[u].size(); i++) {
				const int oe = ou[u][i];
				if (!remove_deg1(getHead(oe))) {
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}
				// Done by PropagateRemNode
				//*
				if (!getEdgeVar(oe).isFixed()) {
					getEdgeVar(oe).setVal(false, r);
					last_state_e[oe] = VT_OUT;
					rem_edge.insert(oe);
					if (DEBUG) {
						std::cout << "Edge out " << oe << '\n';
					}

				} else if (getEdgeVar(oe).isTrue()) {
					if (so.lazy) {
						vec<Lit> psfail;
						psfail.push(getNodeVar(u).getValLit());
						Clause* expl = Clause_new(psfail);
						expl->temp_expl = 1;
						sat.rtrail.last().push(expl);
						sat.confl = expl;
					}
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}  //*/
			}
		}
	}

	return true;
}